

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::LineChart::polylineToString_abi_cxx11_
          (string *__return_storage_ptr__,LineChart *this,Polyline *polyline,Layout *layout)

{
  double dVar1;
  pointer pPVar2;
  Dimensions *pDVar3;
  uint uVar4;
  vector<svg::Circle,_std::allocator<svg::Circle>_> vertices;
  Stroke local_190;
  vector<svg::Circle,_std::allocator<svg::Circle>_> local_160;
  Polyline shifted_polyline;
  Circle local_d8;
  optional<svg::Dimensions> local_68;
  Fill local_50;
  
  Polyline::Polyline(&shifted_polyline,polyline);
  local_d8.super_Shape.super_Serializeable._vptr_Serializeable = (_func_int **)(this->margin).width;
  local_d8.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)(this->margin).height;
  Polyline::offset(&shifted_polyline,(Point *)&local_d8);
  vertices.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  while( true ) {
    pPVar2 = shifted_polyline.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)shifted_polyline.points.
                      super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)shifted_polyline.points.
                      super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) <= (ulong)uVar4) break;
    getDimensions(&local_68,this);
    pDVar3 = optional<svg::Dimensions>::operator->(&local_68);
    dVar1 = pDVar3->height;
    Fill::Fill(&local_50,Black);
    local_190.super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Stroke_0010db00;
    local_190.width = -1.0;
    local_190.color.super_Serializeable._vptr_Serializeable =
         (_func_int **)&PTR__Serializeable_0010dab0;
    local_190.color.transparent = true;
    local_190.color.blue = 0;
    local_190.nonScaling = false;
    local_190.color._12_5_ = 0;
    local_190.color.green._1_3_ = 0;
    Circle::Circle(&local_d8,pPVar2 + uVar4,dVar1 / 30.0,&local_50,&local_190);
    std::vector<svg::Circle,_std::allocator<svg::Circle>_>::emplace_back<svg::Circle>
              (&vertices,&local_d8);
    uVar4 = uVar4 + 1;
  }
  Polyline::toString_abi_cxx11_((string *)&local_d8,&shifted_polyline,layout);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::vector(&local_160,&vertices);
  vectorToString<svg::Circle>((string *)&local_190,&local_160,layout);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&local_160);
  std::__cxx11::string::~string((string *)&local_d8);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&vertices);
  Polyline::~Polyline(&shifted_polyline);
  return __return_storage_ptr__;
}

Assistant:

std::string polylineToString(Polyline const & polyline, Layout const & layout) const
        {
            Polyline shifted_polyline = polyline;
            shifted_polyline.offset(Point(margin.width, margin.height));

            std::vector<Circle> vertices;
            for (unsigned i = 0; i < shifted_polyline.points.size(); ++i)
                vertices.push_back(Circle(shifted_polyline.points[i], getDimensions()->height / 30.0, Color::Black));

            return shifted_polyline.toString(layout) + vectorToString(vertices, layout);
        }